

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3-read.c
# Opt level: O0

int mp3_skip_id3v2(file_t *mp3,mp3_frame_t *frame)

{
  undefined4 uVar1;
  int iVar2;
  size_t tag_size;
  char cStack_28;
  uchar uStack_26;
  byte local_25;
  byte local_24;
  byte local_23;
  uchar id3v2_hdr [10];
  mp3_frame_t *frame_local;
  file_t *mp3_local;
  
  id3v2_hdr._2_8_ = frame;
  if (mp3 == (file_t *)0x0) {
    __assert_fail("mp3 != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3-read.c",0x2e3,
                  "int mp3_skip_id3v2(file_t *, mp3_frame_t *)");
  }
  if (frame != (mp3_frame_t *)0x0) {
    uVar1 = *(undefined4 *)frame->raw;
    tag_size._6_1_ = (char)uVar1;
    if (((tag_size._6_1_ == 'I') &&
        (tag_size._7_1_ = (char)((uint)uVar1 >> 8), tag_size._7_1_ == 'D')) &&
       (cStack_28 = (char)((uint)uVar1 >> 0x10), cStack_28 == '3')) {
      iVar2 = file_read(mp3,&uStack_26,6);
      if (iVar2 == 6) {
        iVar2 = 0;
        if ((local_25 & 0x10) != 0) {
          iVar2 = 10;
        }
        iVar2 = file_seek_fwd(mp3,(long)(int)(((local_24 & 0x7f) << 0x15 | (local_23 & 0x7f) << 0xe
                                               | (id3v2_hdr[0] & 0x7f) << 7 | id3v2_hdr[1] & 0x7f) +
                                             iVar2));
        if (iVar2 == 0) {
          mp3_local._4_4_ = 0;
        }
        else {
          mp3_local._4_4_ = 1;
        }
      }
      else {
        mp3_local._4_4_ = -1;
      }
    }
    else {
      mp3_local._4_4_ = 0;
    }
    return mp3_local._4_4_;
  }
  __assert_fail("frame != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3-read.c",0x2e4,
                "int mp3_skip_id3v2(file_t *, mp3_frame_t *)");
}

Assistant:

int mp3_skip_id3v2(file_t *mp3, mp3_frame_t *frame) {
  assert(mp3 != NULL);
  assert(frame != NULL);

  unsigned char id3v2_hdr[10];
  memcpy(id3v2_hdr, frame->raw, 4);
  if ((id3v2_hdr[0] != 'I') ||
      (id3v2_hdr[1] != 'D') ||
      (id3v2_hdr[2] != '3'))
    return 0;

  if (file_read(mp3, id3v2_hdr + 4, 6) != 6)
    return EEOF;

  /* parse synchsafe integer */
  size_t tag_size = (((id3v2_hdr[6] & 0x7F) << 21) |
                     ((id3v2_hdr[7] & 0x7F) << 14) |
                     ((id3v2_hdr[8] & 0x7F) << 7) |
                     (id3v2_hdr[9] & 0x7F)) +
                    (id3v2_hdr[5] & 0x10 ? 10 : 0);

  if (!file_seek_fwd(mp3, tag_size))
    return 0;

  return 1;
}